

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::BlockGroup::BlockGroup
          (BlockGroup *this,Cluster *pCluster,long idx,longlong block_start,longlong block_size,
          longlong prev,longlong next,longlong duration,longlong discard_padding)

{
  longlong prev_local;
  longlong block_size_local;
  longlong block_start_local;
  long idx_local;
  Cluster *pCluster_local;
  BlockGroup *this_local;
  
  BlockEntry::BlockEntry(&this->super_BlockEntry,pCluster,idx);
  (this->super_BlockEntry)._vptr_BlockEntry = (_func_int **)&PTR__BlockGroup_00140c48;
  Block::Block(&this->m_block,block_start,block_size,discard_padding);
  this->m_prev = prev;
  this->m_next = next;
  this->m_duration = duration;
  return;
}

Assistant:

BlockGroup::BlockGroup(Cluster* pCluster, long idx, long long block_start,
                       long long block_size, long long prev, long long next,
                       long long duration, long long discard_padding)
    : BlockEntry(pCluster, idx),
      m_block(block_start, block_size, discard_padding),
      m_prev(prev),
      m_next(next),
      m_duration(duration) {}